

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

int PHYSFS_seek(PHYSFS_File *handle,PHYSFS_uint64 pos)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  
  iVar2 = PHYSFS_flush(handle);
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    if ((handle[3].opaque == (void *)0x0) || (*(char *)&handle[1].opaque == '\0')) {
LAB_00109c6f:
      handle[5].opaque = (void *)0x0;
      handle[6].opaque = (void *)0x0;
      iVar2 = (**(code **)((long)handle->opaque + 0x20))(handle->opaque,pos);
      return iVar2;
    }
    lVar3 = (**(code **)((long)handle->opaque + 0x28))();
    pvVar1 = handle[5].opaque;
    if (*(char *)&handle[1].opaque == '\0') {
      lVar3 = lVar3 + (long)pvVar1;
    }
    else {
      lVar3 = (lVar3 - (long)pvVar1) + (long)handle[6].opaque;
    }
    uVar5 = pos - lVar3;
    if ((long)uVar5 < 0) {
      pvVar4 = handle[6].opaque;
      if (pvVar4 < (void *)-uVar5) goto LAB_00109c6f;
    }
    else {
      pvVar4 = handle[6].opaque;
      if ((ulong)((long)pvVar1 - (long)pvVar4) < uVar5) goto LAB_00109c6f;
    }
    handle[6].opaque = (void *)((long)pvVar4 + uVar5);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int PHYSFS_seek(PHYSFS_File *handle, PHYSFS_uint64 pos)
{
    FileHandle *fh = (FileHandle *) handle;
    BAIL_IF_ERRPASS(!PHYSFS_flush(handle), 0);

    if (fh->buffer && fh->forReading)
    {
        /* avoid throwing away our precious buffer if seeking within it. */
        PHYSFS_sint64 offset = pos - PHYSFS_tell(handle);
        if ( /* seeking within the already-buffered range? */
             /* forward? */
            ((offset >= 0) && (((size_t)offset) <= fh->buffill-fh->bufpos)) ||
            /* backward? */
            ((offset < 0) && (((size_t) -offset) <= fh->bufpos)) )
        {
            fh->bufpos = (size_t) (((PHYSFS_sint64) fh->bufpos) + offset);
            return 1; /* successful seek */
        } /* if */
    } /* if */

    /* we have to fall back to a 'raw' seek. */
    fh->buffill = fh->bufpos = 0;
    return fh->io->seek(fh->io, pos);
}